

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

void * stack_push_internal(AbstractStack *s,void *elem)

{
  size_t __size;
  int iVar1;
  void **ppvVar2;
  void **__dest;
  long lVar3;
  ulong uVar4;
  
  ppvVar2 = s->start;
  uVar4 = (long)s->cur - (long)ppvVar2;
  iVar1 = (int)(uVar4 >> 3);
  lVar3 = (long)(iVar1 * 2);
  __size = lVar3 * 8;
  if (ppvVar2 == s->initial) {
    __dest = (void **)malloc(__size);
    s->cur = __dest;
    memcpy(__dest,ppvVar2,(long)(uVar4 * 0x20000000) >> 0x1d & 0xfffffffffffffff8);
  }
  else {
    ppvVar2 = (void **)realloc(ppvVar2,__size);
    s->cur = ppvVar2;
  }
  ppvVar2 = s->cur;
  s->start = ppvVar2;
  s->end = ppvVar2 + lVar3;
  s->cur = ppvVar2 + (long)iVar1 + 1;
  (ppvVar2 + (long)iVar1 + 1)[-1] = elem;
  return elem;
}

Assistant:

void *stack_push_internal(AbstractStack *s, void *elem) {
  int n = s->cur - s->start;
  if (s->start == s->initial) {
    s->cur = (void **)MALLOC(n * 2 * sizeof(void *));
    memcpy(s->cur, s->start, n * sizeof(void *));
  } else
    s->cur = (void **)REALLOC(s->start, n * 2 * sizeof(void *));
  s->end = s->start = s->cur;
  s->cur += n;
  s->end += n * 2;
  *s->cur++ = elem;
  return elem;
}